

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int iVar2;
  LagrangePolynomial lp;
  int n;
  string path;
  vector<int,_std::allocator<int>_> data_x;
  vector<int,_std::allocator<int>_> data_y;
  vector<poly,_std::allocator<poly>_> local_1b0;
  _Vector_base<int,_std::allocator<int>_> local_198;
  vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> results;
  vector<poly,_std::allocator<poly>_> basis_p;
  _Vector_base<int,_std::allocator<int>_> local_150;
  BasisPolynomial bp;
  
  std::operator<<((ostream *)&std::cout,"Enter number of terms(n): ");
  std::istream::operator>>((istream *)&std::cin,&n);
  if (n < 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"That\'s Invalid. Please don\'t mess around :-(")
    ;
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    data_x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    data_x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    data_x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::operator<<((ostream *)&std::cout,"Enter the first n terms of the series: ");
    for (iVar2 = 1; iVar2 + -1 < n; iVar2 = iVar2 + 1) {
      std::istream::operator>>((istream *)&std::cin,(int *)&bp);
      std::vector<int,_std::allocator<int>_>::push_back(&data_y,(value_type_conflict *)&bp);
      path._M_dataplus._M_p._0_4_ = iVar2;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&data_x,(int *)&path);
    }
    path._M_dataplus._M_p = (pointer)&path.field_2;
    path._M_string_length = 0;
    path.field_2._M_local_buf[0] = '\0';
    std::operator<<((ostream *)&std::cout,
                    "Enter destination for source files [Current folder if empty]:");
    std::istream::ignore();
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&path);
    if (path._M_string_length == 0) {
      getcwd((char *)&bp,0xff);
      std::__cxx11::string::assign((char *)&path);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"Using path: ");
    poVar1 = std::operator<<(poVar1,(string *)&path);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_150,&data_x);
    BasisPolynomial::BasisPolynomial(&bp,(vector<int,_std::allocator<int>_> *)&local_150);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_150);
    BasisPolynomial::get_all_basis_polynomials(&basis_p,&bp);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_198,&data_y);
    std::vector<poly,_std::allocator<poly>_>::vector(&local_1b0,&basis_p);
    LagrangePolynomial::get_lagrange_polynomial
              (&results,&lp,(vector<int,_std::allocator<int>_> *)&local_198,&local_1b0);
    std::vector<poly,_std::allocator<poly>_>::~vector(&local_1b0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_198);
    generate_all_programs(&results,&path);
    poVar1 = std::operator<<((ostream *)&std::cout,"\nDone. May the force be with you :-)");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::~vector
              (&results);
    std::vector<poly,_std::allocator<poly>_>::~vector(&basis_p);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&bp);
    std::__cxx11::string::~string((string *)&path);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&data_x.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&data_y.super__Vector_base<int,_std::allocator<int>_>);
  }
  return 0;
}

Assistant:

int main() {
    int n;
    cout << "Enter number of terms(n): ";
    cin >> n ;

    if(n<=0){ // If the user enters a character, it will still be 0
        cout << "That's Invalid. Please don't mess around :-(" << endl;
        return 0;
    }

    vector<int> data_y; // f(x)
    vector<int> data_x; // x

    cout << "Enter the first n terms of the series: ";
    for(int i=0; i<n; i++){
        int k;
        cin >> k;
        data_y.push_back(k);
        data_x.push_back(i+1);
    }

    string path;
    cout << "Enter destination for source files [Current folder if empty]:";

    cin.ignore();
    getline(cin,path);
    if (path.empty()){
        char pwd[256];
        getcwd(pwd, 255);
        path = pwd;
    }
    cout << "Using path: " << path << endl;

    BasisPolynomial bp(data_x); // generating basis polynomials
    vector<poly> basis_p = bp.get_all_basis_polynomials();

    LagrangePolynomial lp; // generating the lagrange polynomial
    vector<LagrangePolynomial::element> results = lp.get_lagrange_polynomial(data_y,basis_p);

    generate_all_programs(results,path);
    cout << "\nDone. May the force be with you :-)" << endl;

    return 0;
}